

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O1

void __thiscall
csv::internals::
StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
::next(StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,size_t bytes)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  undefined8 *puVar4;
  char *pcVar5;
  ulong uVar6;
  RawCSVData *pRVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  RawCSVData *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  size_t sVar13;
  void *__tmp;
  ulong uVar14;
  undefined1 local_39;
  RawCSVData *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  if ((this->super_IBasicCSVParser)._eof == false) {
    local_38 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<csv::internals::RawCSVData,std::allocator<csv::internals::RawCSVData>>
              (&_Stack_30,&local_38,(allocator<csv::internals::RawCSVData> *)&local_39);
    _Var8._M_pi = _Stack_30._M_pi;
    pRVar7 = local_38;
    local_38 = (RawCSVData *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->super_IBasicCSVParser).data_ptr.
    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pRVar7;
    (this->super_IBasicCSVParser).data_ptr.
    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var8._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
    memcpy(&((this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            parse_flags,&(this->super_IBasicCSVParser)._parse_flags,0x400);
    peVar2 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar2->col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->super_IBasicCSVParser)._col_names.
             super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar2->col_names).
                super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&(this->super_IBasicCSVParser)._col_names.
                 super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    (this->super_IBasicCSVParser).fields =
         &((this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          fields;
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    p_Var9->_M_use_count = 1;
    p_Var9->_M_weak_count = 1;
    p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00112c80;
    p_Var9[1]._vptr__Sp_counted_base = (_func_int **)(p_Var9 + 2);
    p_Var9[1]._M_use_count = 0;
    p_Var9[1]._M_weak_count = 0;
    *(undefined1 *)&p_Var9[2]._vptr__Sp_counted_base = 0;
    peVar2 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = p_Var9 + 1;
    p_Var1 = (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var9;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if ((this->super_IBasicCSVParser).source_size == 0) {
      lVar10 = std::istream::tellg();
      std::istream::seekg((long)&this->_source,_S_beg);
      lVar11 = std::istream::tellg();
      std::istream::seekg((long)&this->_source,_S_beg);
      (this->super_IBasicCSVParser).source_size = lVar11 - lVar10;
    }
    sVar13 = this->stream_pos;
    uVar14 = (this->super_IBasicCSVParser).source_size - sVar13;
    if (bytes <= uVar14) {
      uVar14 = bytes;
    }
    pvVar12 = operator_new__(uVar14);
    std::istream::seekg((long)&this->_source,(_Ios_Seekdir)sVar13);
    std::istream::read((char *)&this->_source,(long)pvVar12);
    sVar13 = std::istream::tellg();
    this->stream_pos = sVar13;
    peVar3 = (((this->super_IBasicCSVParser).data_ptr.
               super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::_M_replace((ulong)peVar3,0,*(char **)((long)peVar3 + 8),(ulong)pvVar12);
    peVar2 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    puVar4 = (undefined8 *)
             (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar5 = (char *)*puVar4;
    (peVar2->data)._M_len = puVar4[1];
    (peVar2->data)._M_str = pcVar5;
    peVar2 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
    }
    (this->super_IBasicCSVParser).current_row.data.
    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    p_Var9 = (this->super_IBasicCSVParser).current_row.data.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->super_IBasicCSVParser).current_row.data.
    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var1;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
    (this->super_IBasicCSVParser).current_row.data_start = 0;
    (this->super_IBasicCSVParser).current_row.fields_start = 0;
    (this->super_IBasicCSVParser).current_row.row_length = 0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    sVar13 = IBasicCSVParser::parse(&this->super_IBasicCSVParser);
    uVar6 = (this->super_IBasicCSVParser).source_size;
    if (this->stream_pos == uVar6 || uVar6 < 10000000) {
      (this->super_IBasicCSVParser)._eof = true;
      IBasicCSVParser::end_feed(&this->super_IBasicCSVParser);
    }
    else {
      this->stream_pos = (sVar13 - uVar14) + this->stream_pos;
    }
    operator_delete__(pvVar12);
  }
  return;
}

Assistant:

void next(size_t bytes = ITERATION_CHUNK_SIZE) override {
                if (this->eof()) return;

                this->reset_data_ptr();
                this->data_ptr->_data = std::make_shared<std::string>();

                if (source_size == 0) {
                    const auto start = _source.tellg();
                    _source.seekg(0, std::ios::end);
                    const auto end = _source.tellg();
                    _source.seekg(0, std::ios::beg);

                    source_size = end - start;
                }

                // Read data into buffer
                size_t length = std::min(source_size - stream_pos, bytes);
                std::unique_ptr<char[]> buff(new char[length]);
                _source.seekg(stream_pos, std::ios::beg);
                _source.read(buff.get(), length);
                stream_pos = _source.tellg();
                ((std::string*)(this->data_ptr->_data.get()))->assign(buff.get(), length);

                // Create string_view
                this->data_ptr->data = *((std::string*)this->data_ptr->_data.get());

                // Parse
                this->current_row = CSVRow(this->data_ptr);
                size_t remainder = this->parse();

                if (stream_pos == source_size || no_chunk()) {
                    this->_eof = true;
                    this->end_feed();
                }
                else {
                    this->stream_pos -= (length - remainder);
                }
            }